

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O3

void duckdb::Prefix::ConcatGate(ART *art,Node *parent,uint8_t byte,Node *child)

{
  ulong uVar1;
  byte bVar2;
  idx_t iVar3;
  Prefix prefix;
  uint8_t local_51;
  IndexPointer local_50;
  Prefix local_48;
  
  local_50.data = 0;
  uVar1 = (child->super_IndexPointer).data;
  bVar2 = (byte)(uVar1 >> 0x38);
  local_51 = byte;
  if ((bVar2 & 0x7f) == 1) {
    NewInternal(&local_48,art,(Node *)&local_50,&local_51,'\x01',0,PREFIX);
    ((local_48.ptr)->super_IndexPointer).data = 0;
    Append(&local_48,art,(Node)(child->super_IndexPointer).data);
  }
  else {
    if ((bVar2 & 0x7f) == 7) {
      iVar3 = uVar1 & 0xffffffffffffff | 0x700000000000000;
      goto LAB_016ead9a;
    }
    NewInternal(&local_48,art,(Node *)&local_50,&local_51,'\x01',0,PREFIX);
    ((local_48.ptr)->super_IndexPointer).data = (child->super_IndexPointer).data;
  }
  iVar3 = local_50.data | 0x8000000000000000;
LAB_016ead9a:
  if (((parent->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000) {
    GetTail(&local_48,art,parent);
    ((local_48.ptr)->super_IndexPointer).data = iVar3;
  }
  else {
    (parent->super_IndexPointer).data = iVar3;
  }
  return;
}

Assistant:

void Prefix::ConcatGate(ART &art, Node &parent, uint8_t byte, const Node &child) {
	D_ASSERT(child.HasMetadata());
	Node new_prefix = Node();

	// Inside gates, inlined row IDs are not prefixed.
	if (child.GetType() == NType::LEAF_INLINED) {
		Leaf::New(new_prefix, child.GetRowId());

	} else if (child.GetType() == PREFIX) {
		// At least one more row ID in this gate.
		auto prefix = NewInternal(art, new_prefix, &byte, 1, 0, PREFIX);
		prefix.ptr->Clear();
		prefix.Append(art, child);
		new_prefix.SetGateStatus(GateStatus::GATE_SET);

	} else {
		// At least one more row ID in this gate.
		auto prefix = NewInternal(art, new_prefix, &byte, 1, 0, PREFIX);
		*prefix.ptr = child;
		new_prefix.SetGateStatus(GateStatus::GATE_SET);
	}

	if (parent.GetType() != PREFIX) {
		parent = new_prefix;
		return;
	}
	*GetTail(art, parent).ptr = new_prefix;
}